

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * dialogNameOnly(void)

{
  int iVar1;
  char *pcVar2;
  
  if (((dialogNameOnly::lDialogName[0] == '*') &&
      (((iVar1 = isDarwin(), iVar1 == 0 ||
        (pcVar2 = strcpy(dialogNameOnly::lDialogName,"/opt/local/bin/dialog"), pcVar2 == (char *)0x0
        )) || (iVar1 = detectPresence(dialogNameOnly::lDialogName), iVar1 == 0)))) &&
     ((pcVar2 = strcpy(dialogNameOnly::lDialogName,"dialog"), pcVar2 == (char *)0x0 ||
      (iVar1 = detectPresence(dialogNameOnly::lDialogName), iVar1 == 0)))) {
    strcpy(dialogNameOnly::lDialogName,"");
  }
  return dialogNameOnly::lDialogName;
}

Assistant:

static char const * dialogNameOnly( )
{
        static char lDialogName[128] = "*" ;
        if ( lDialogName[0] == '*' )
        {
                if ( isDarwin() && strcpy(lDialogName , "/opt/local/bin/dialog" )
                        && detectPresence( lDialogName ) )
                {}
                else if ( strcpy(lDialogName , "dialog" )
                        && detectPresence( lDialogName ) )
                {}
                else
                {
                        strcpy(lDialogName , "" ) ;
                }
        }
    return lDialogName ;
}